

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  double *in_RDI;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  Value *in_stack_fffffffffffffaf8;
  ostringstream *this_00;
  string *in_stack_fffffffffffffb00;
  string *msg;
  string local_4e8 [32];
  ostringstream local_4c8 [376];
  string local_350 [32];
  ostringstream local_330 [376];
  string local_1b8 [48];
  string local_188 [12];
  double local_8;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_8 = 0.0;
    break;
  case 1:
    local_8 = *in_RDI;
    break;
  case 2:
    bVar1 = isInt64(in_stack_fffffffffffffaf8);
    if (!bVar1) {
      msg = local_188;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)msg);
      std::operator<<((ostream *)msg,"LargestUInt out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(msg);
      std::__cxx11::string::~string(local_1b8);
      abort();
    }
    local_8 = *in_RDI;
    break;
  case 3:
    bVar1 = InRange<long_long,long_long>(*in_RDI,-0x8000000000000000,0x7fffffffffffffff);
    if (!bVar1) {
      this_00 = local_330;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"double out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string(local_350);
      abort();
    }
    local_8 = (double)(long)*in_RDI;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_4c8);
    std::operator<<((ostream *)local_4c8,"Value is not convertible to Int64.");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_4e8);
    abort();
  case 5:
    local_8 = (double)(long)(int)(uint)(((ulong)*in_RDI & 1) != 0);
  }
  return (Int64)local_8;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}